

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O2

void __thiscall avro::json::JsonGenerator::escapeCtl(JsonGenerator *this,char c)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  uint uVar4;
  undefined7 in_register_00000031;
  ulong uVar5;
  
  uVar5 = CONCAT71(in_register_00000031,c) & 0xffffffff;
  StreamWriter::write(&this->out_,0x5c,in_RDX,in_RCX);
  StreamWriter::write(&this->out_,0x55,__buf,in_RCX);
  StreamWriter::write(&this->out_,0x30,__buf_00,in_RCX);
  StreamWriter::write(&this->out_,0x30,__buf_01,in_RCX);
  uVar2 = uVar5 >> 4 & 0xf;
  uVar3 = (int)uVar2 + 0x30;
  uVar4 = (uint)(byte)((char)uVar2 + 0x57);
  if ((byte)uVar5 < 0xa0) {
    uVar4 = uVar3;
  }
  StreamWriter::write(&this->out_,uVar4,__buf_02,(ulong)uVar3);
  uVar2 = CONCAT71(in_register_00000031,c) & 0xffffff0f;
  iVar1 = (int)uVar2;
  uVar3 = iVar1 + 0x57;
  uVar4 = uVar3;
  if ((byte)uVar2 < 10) {
    uVar4 = iVar1 + 0x30;
  }
  StreamWriter::write(&this->out_,uVar4 & 0xff,__buf_03,(ulong)uVar3);
  return;
}

Assistant:

void escapeCtl(char c) {
        out_.write('\\');
        out_.write('U');
        out_.write('0');
        out_.write('0');
        out_.write(toHex((static_cast<unsigned char>(c)) / 16));
        out_.write(toHex((static_cast<unsigned char>(c)) % 16));
    }